

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlRenderer::DebugClasses
          (GdlRenderer *this,ostream *strmOut,
          vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *vpglfcReplcmt,
          int cpglfcLinear)

{
  GdlGlyphClassDefn *pGVar1;
  pointer ppGVar2;
  ulong uVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vwGlyphs;
  vector<int,_std::allocator<int>_> vnIndices;
  
  std::operator<<(strmOut,"LINEAR (OUTPUT) CLASSES");
  uVar8 = 0;
  uVar3 = 0;
  if (0 < cpglfcLinear) {
    uVar3 = (ulong)(uint)cpglfcLinear;
  }
  for (; uVar8 != uVar3; uVar8 = uVar8 + 1) {
    pGVar1 = (vpglfcReplcmt->
             super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar8];
    std::operator<<(strmOut,"\n\n");
    poVar4 = std::operator<<(strmOut,"Class #");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)uVar8);
    std::operator<<(poVar4,": ");
    std::__cxx11::string::string((string *)&vwGlyphs,(string *)&pGVar1->m_staName);
    std::operator<<(strmOut,(string *)&vwGlyphs);
    std::__cxx11::string::~string((string *)&vwGlyphs);
    vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GdlGlyphClassDefn::GenerateOutputGlyphList(pGVar1,&vwGlyphs);
    for (uVar5 = 0;
        uVar5 < (ulong)((long)vwGlyphs.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)vwGlyphs.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 1); uVar5 = uVar5 + 1) {
      if ((uVar5 / 10) * 10 - uVar5 == 0) {
        poVar4 = std::operator<<(strmOut,"\n");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4,":");
      }
      std::operator<<(strmOut,"   ");
      GrcManager::DebugHex
                (strmOut,vwGlyphs.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar5]);
    }
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              (&vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  }
  std::operator<<(strmOut,"\n\n\nINDEXED (INPUT) CLASSES");
  for (lVar6 = (long)cpglfcLinear;
      ppGVar2 = (vpglfcReplcmt->
                super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>).
                _M_impl.super__Vector_impl_data._M_start,
      lVar6 < (int)((ulong)((long)(vpglfcReplcmt->
                                  super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2) >> 3)
      ; lVar6 = lVar6 + 1) {
    pGVar1 = ppGVar2[lVar6];
    std::operator<<(strmOut,"\n\n");
    poVar4 = std::operator<<(strmOut,"Class #");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)lVar6);
    std::operator<<(poVar4,": ");
    std::__cxx11::string::string((string *)&vwGlyphs,(string *)&pGVar1->m_staName);
    std::operator<<(strmOut,(string *)&vwGlyphs);
    std::__cxx11::string::~string((string *)&vwGlyphs);
    vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vnIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    vnIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vnIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    GdlGlyphClassDefn::GenerateInputGlyphList(pGVar1,&vwGlyphs,&vnIndices);
    for (uVar3 = 0;
        uVar3 < (ulong)((long)vwGlyphs.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)vwGlyphs.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 1); uVar3 = uVar3 + 1) {
      if ((uVar3 / 5) * 5 == uVar3) {
        std::operator<<(strmOut,"\n");
      }
      GrcManager::DebugHex
                (strmOut,vwGlyphs.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar3]);
      std::operator<<(strmOut," :");
      iVar7 = vnIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3];
      if (iVar7 < 1000) {
        std::operator<<(strmOut," ");
        iVar7 = vnIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3];
        if (iVar7 < 100) {
          std::operator<<(strmOut," ");
          iVar7 = vnIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3];
          if (iVar7 < 10) {
            std::operator<<(strmOut," ");
            iVar7 = vnIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar3];
          }
        }
      }
      std::ostream::operator<<(strmOut,iVar7);
      std::operator<<(strmOut,"    ");
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&vnIndices.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              (&vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  }
  return;
}

Assistant:

void GdlRenderer::DebugClasses(std::ostream & strmOut,
	std::vector<GdlGlyphClassDefn *> & vpglfcReplcmt, int cpglfcLinear)
{
	strmOut << "LINEAR (OUTPUT) CLASSES";

	//	linear classes (output)
	int cTmp = 0;
	int ipglfc;
	for (ipglfc = 0; ipglfc < cpglfcLinear; ipglfc++)
	{
		GdlGlyphClassDefn * pglfc = vpglfcReplcmt[ipglfc];

		Assert(pglfc->ReplcmtOutputClass() || pglfc->GlyphIDCount() <= 1);
		//Assert(pglfc->ReplcmtOutputID() == cTmp);

		strmOut << "\n\n";
		strmOut << "Class #" << ipglfc << ": ";
		strmOut << pglfc->Name();

		std::vector<utf16> vwGlyphs;
		pglfc->GenerateOutputGlyphList(vwGlyphs);

		//	glyph list
		for (size_t iw = 0; iw < vwGlyphs.size(); iw++)
		{
			if (iw % 10 == 0)
			{
				strmOut << "\n" << iw << ":";
			}
			strmOut << "   ";
			GrcManager::DebugHex(strmOut, vwGlyphs[iw]);
		}

		cTmp++;
	}

	strmOut << "\n\n\nINDEXED (INPUT) CLASSES";

	//	indexed classes (input)
	for (ipglfc = cpglfcLinear; ipglfc < signed(vpglfcReplcmt.size()); ipglfc++)
	{
		GdlGlyphClassDefn * pglfc = vpglfcReplcmt[ipglfc];

		Assert(pglfc->ReplcmtInputClass());
		Assert(pglfc->ReplcmtInputID() == cTmp);

		strmOut << "\n\n";
		strmOut << "Class #" << ipglfc << ": ";
		strmOut << pglfc->Name();

		std::vector<utf16> vwGlyphs;
		std::vector<int> vnIndices;
		pglfc->GenerateInputGlyphList(vwGlyphs, vnIndices);
		//	glyph list
		for (size_t iw = 0; iw < vwGlyphs.size(); iw++)
		{
			if (iw % 5 == 0)
			{
				strmOut << "\n";
			}
			GrcManager::DebugHex(strmOut, vwGlyphs[iw]);
			strmOut << " :";
			if (vnIndices[iw] < 1000) strmOut << " ";
			if (vnIndices[iw] < 100)  strmOut << " ";
			if (vnIndices[iw] < 10)   strmOut << " ";
			strmOut << vnIndices[iw];
			strmOut << "    ";
		}

		cTmp++;
	}
}